

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSObjectFactory::processAttUse
          (XSObjectFactory *this,SchemaAttDef *attDef,XSAttributeUse *xsAttUse)

{
  DefAttTypes DVar1;
  XMLCh *constraintValue;
  VALUE_CONSTRAINT local_28;
  bool local_21;
  VALUE_CONSTRAINT constraintType;
  bool isRequired;
  XSAttributeUse *xsAttUse_local;
  SchemaAttDef *attDef_local;
  XSObjectFactory *this_local;
  
  local_21 = false;
  local_28 = VALUE_CONSTRAINT_NONE;
  DVar1 = XMLAttDef::getDefaultType(&attDef->super_XMLAttDef);
  if (DVar1 == DefAttTypes_Min) {
    local_28 = VALUE_CONSTRAINT_DEFAULT;
  }
  else {
    DVar1 = XMLAttDef::getDefaultType(&attDef->super_XMLAttDef);
    if ((DVar1 == Fixed) ||
       (DVar1 = XMLAttDef::getDefaultType(&attDef->super_XMLAttDef), DVar1 == Required_And_Fixed)) {
      local_28 = VALUE_CONSTRAINT_FIXED;
    }
  }
  DVar1 = XMLAttDef::getDefaultType(&attDef->super_XMLAttDef);
  if ((DVar1 == Required) ||
     (DVar1 = XMLAttDef::getDefaultType(&attDef->super_XMLAttDef), DVar1 == Required_And_Fixed)) {
    local_21 = true;
  }
  constraintValue = XMLAttDef::getValue(&attDef->super_XMLAttDef);
  XSAttributeUse::set(xsAttUse,local_21,local_28,constraintValue);
  return;
}

Assistant:

void XSObjectFactory::processAttUse(SchemaAttDef* const attDef,
                                    XSAttributeUse* const xsAttUse)
{
    bool isRequired = false;
    XSConstants::VALUE_CONSTRAINT constraintType = XSConstants::VALUE_CONSTRAINT_NONE;

    if (attDef->getDefaultType() == XMLAttDef::Default)
    {
        constraintType = XSConstants::VALUE_CONSTRAINT_DEFAULT;
    }
    else if ((attDef->getDefaultType() == XMLAttDef::Fixed) ||
             (attDef->getDefaultType() == XMLAttDef::Required_And_Fixed))
    {
        constraintType = XSConstants::VALUE_CONSTRAINT_FIXED;
    }

    if (attDef->getDefaultType() == XMLAttDef::Required ||
        attDef->getDefaultType() == XMLAttDef::Required_And_Fixed)
        isRequired = true;

    xsAttUse->set(isRequired, constraintType, attDef->getValue());
}